

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

uint fl_utf8fromwc(char *dst,uint dstlen,wchar_t *src,uint srclen)

{
  wchar_t wVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  char cVar8;
  wchar_t wVar9;
  
  if (dstlen == 0) {
    uVar4 = 0;
    uVar3 = 0;
LAB_001f73e6:
    for (uVar4 = uVar4 & 0xffffffff; uVar4 < srclen; uVar4 = uVar4 + 1) {
      wVar9 = src[uVar4];
      iVar5 = 1;
      if ((0x7f < (uint)wVar9) && (iVar5 = 2, 0x7ff < (uint)wVar9)) {
        iVar5 = ((uint)(wVar9 + L'\xffff0000') < 0x100000) + 3;
      }
      uVar3 = uVar3 + iVar5;
    }
  }
  else {
    uVar3 = 0;
    for (uVar4 = 1; uVar4 - srclen != 1; uVar4 = uVar4 + 1) {
      wVar9 = src[uVar4 - 1];
      if ((uint)wVar9 < 0x80) {
        uVar2 = uVar3 + 1;
        cVar8 = (char)wVar9;
        if (dstlen <= uVar2) {
          cVar8 = '\0';
        }
        dst[uVar3] = cVar8;
        uVar3 = uVar2;
        if (dstlen <= uVar2) goto LAB_001f73e6;
      }
      else {
        if ((uint)wVar9 < 0x800) {
          uVar2 = uVar3 + 2;
          if (dstlen <= uVar2) goto LAB_001f73de;
          bVar6 = (byte)((uint)wVar9 >> 6) | 0xc0;
          iVar5 = 1;
          uVar7 = (ulong)uVar3;
        }
        else {
          wVar1 = wVar9;
          if (((uint)wVar9 < 0x10000) || (wVar1 = L'�', 0x10ffff < (uint)wVar9)) {
            wVar9 = wVar1;
            uVar2 = uVar3 + 3;
            if (dstlen <= uVar2) {
LAB_001f73de:
              dst[uVar3] = '\0';
              uVar3 = uVar2;
              goto LAB_001f73e6;
            }
            uVar7 = (ulong)(uVar3 + 1);
            dst[uVar3] = (byte)((uint)wVar9 >> 0xc) | 0xe0;
            bVar6 = (byte)((uint)wVar9 >> 6) & 0x3f | 0x80;
            iVar5 = 2;
          }
          else {
            uVar2 = uVar3 + 4;
            if (dstlen <= uVar2) goto LAB_001f73de;
            dst[uVar3] = (byte)((uint)wVar9 >> 0x12) | 0xf0;
            uVar7 = (ulong)(uVar3 + 2);
            dst[uVar3 + 1] = (byte)((uint)wVar9 >> 0xc) & 0x3f | 0x80;
            bVar6 = (byte)((uint)wVar9 >> 6) & 0x3f | 0x80;
            iVar5 = 3;
          }
        }
        dst[uVar7] = bVar6;
        dst[uVar3 + iVar5] = (byte)wVar9 & 0x3f | 0x80;
        uVar3 = uVar2;
      }
    }
    dst[uVar3] = '\0';
  }
  return uVar3;
}

Assistant:

unsigned fl_utf8fromwc(char* dst, unsigned dstlen,
		    const wchar_t* src, unsigned srclen) {
  unsigned i = 0;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned ucs;
    if (i >= srclen) {dst[count] = 0; return count;}
    ucs = src[i++];
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else if (ucs < 0x800U) { /* 2 bytes */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen &&
	       src[i] >= 0xdc00 && src[i] <= 0xdfff) {
      /* surrogate pair */
      unsigned ucs2 = src[i++];
      ucs = 0x10000U + ((ucs&0x3ff)<<10) + (ucs2&0x3ff);
      /* all surrogate pairs turn into 4-byte UTF-8 */
#else
    } else if (ucs >= 0x10000) {
      if (ucs > 0x10ffff) {
	ucs = 0xfffd;
	goto J1;
      }
#endif
      if (count+4 >= dstlen) {dst[count] = 0; count += 4; break;}
      dst[count++] = 0xf0 | (ucs >> 18);
      dst[count++] = 0x80 | ((ucs >> 12) & 0x3F);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    } else {
#if !(defined(WIN32) || defined(__CYGWIN__))
    J1:
#endif
      /* all others are 3 bytes: */
      if (count+3 >= dstlen) {dst[count] = 0; count += 3; break;}
      dst[count++] = 0xe0 | (ucs >> 12);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (i < srclen) {
    unsigned ucs = src[i++];
    if (ucs < 0x80U) {
      count++;
    } else if (ucs < 0x800U) { /* 2 bytes */
      count += 2;
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen-1 &&
	       src[i+1] >= 0xdc00 && src[i+1] <= 0xdfff) {
      /* surrogate pair */
      ++i;
#else
    } else if (ucs >= 0x10000 && ucs <= 0x10ffff) {
#endif
      count += 4;
    } else {
      count += 3;
    }
  }
  return count;
}